

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

void __thiscall
TTD::SlabAllocatorBase<0>::SlabAllocatorBase(SlabAllocatorBase<0> *this,uint32 slabBlockSize)

{
  Memory *this_00;
  uchar *alloc;
  byte *dataArray;
  TrackAllocData local_48;
  SlabBlock *local_20;
  byte *allocBlock;
  SlabAllocatorBase<0> *pSStack_10;
  uint32 slabBlockSize_local;
  SlabAllocatorBase<0> *this_local;
  
  this->m_slabBlockSize = slabBlockSize;
  this->m_largeBlockList = (LargeSlabBlock *)0x0;
  allocBlock._4_4_ = slabBlockSize;
  pSStack_10 = this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&unsigned_char::typeinfo,0,(ulong)this->m_slabBlockSize,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Debug/TTSupport.h"
             ,0x267);
  this_00 = (Memory *)
            Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_48);
  alloc = Memory::AllocateArray<Memory::HeapAllocator,unsigned_char,true>
                    (this_00,(HeapAllocator *)Memory::HeapAllocator::NoThrowAlloc,0,
                     (ulong)this->m_slabBlockSize);
  local_20 = (SlabBlock *)TTD_MEM_ALLOC_CHECK<unsigned_char>(alloc);
  if (((ulong)local_20 & 3) != 0) {
    TTDAbort_unrecoverable_error
              ("We have non-word aligned allocations so all our later work is not so useful");
  }
  this->m_headBlock = local_20;
  local_20 = local_20 + 1;
  this->m_currPos = (byte *)local_20;
  this->m_endPos = (uchar *)((long)&local_20[-1].BlockData + (ulong)this->m_slabBlockSize);
  this->m_headBlock->BlockData = (byte *)local_20;
  this->m_headBlock->Next = (SlabBlock *)0x0;
  this->m_headBlock->Previous = (SlabBlock *)0x0;
  this->m_headBlock->RefCounter = 0;
  this->m_totalAllocatedSize = 0;
  this->m_reserveActiveBytes = 0;
  this->m_reserveActiveLargeBlock = (LargeSlabBlock *)0x0;
  return;
}

Assistant:

SlabAllocatorBase(uint32 slabBlockSize)
            : m_largeBlockList(nullptr), m_slabBlockSize(slabBlockSize)
        {
            byte* allocBlock = TT_HEAP_ALLOC_ARRAY(byte, this->m_slabBlockSize);
            TTDAssert((reinterpret_cast<uint64>(allocBlock) & 0x3) == 0, "We have non-word aligned allocations so all our later work is not so useful");

            this->m_headBlock = (SlabBlock*)allocBlock;
            byte* dataArray = (allocBlock + TTD_SLAB_BLOCK_SIZE);

            this->m_currPos = dataArray;
            this->m_endPos = dataArray + TTD_SLAB_BLOCK_USABLE_SIZE(this->m_slabBlockSize);

            this->m_headBlock->BlockData = dataArray;

            this->m_headBlock->Next = nullptr;
            this->m_headBlock->Previous = nullptr;

            this->m_headBlock->RefCounter = 0;

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
            this->m_totalAllocatedSize = 0;
#endif

            this->m_reserveActiveBytes = 0;
            this->m_reserveActiveLargeBlock = nullptr;
        }